

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_replaceRangeAString_success_nullptrReplaceString_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x139475;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"012xxx34",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1394b3;
  bVar1 = AString_replaceRangeAString(&string,0x29a,0x2a,(AString *)0x0);
  if (bVar1 == false) {
    pcVar4 = "Assertion \'AString_replaceRangeAString(&string, 666, 42, ((void*)0))\' failed";
    iVar2 = 0x68b;
LAB_00139c47:
    uStack_50 = 0x139c53;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar4,0,0);
  }
  uStack_50 = 0x1394cc;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x68b);
  if (string.capacity != 8) {
    local_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar8 = "(string).capacity";
    pcVar4 = (char *)string.capacity;
LAB_00139927:
    iVar2 = 0x68c;
    goto LAB_00139c82;
  }
  uStack_50 = 0x1394ec;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x68c);
  if (string.buffer == (char *)0x0) {
    ppcVar7 = &local_58;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar2 = 0x68c;
    goto LAB_00139dad;
  }
  uStack_50 = 0x139509;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x68c);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar4 = "";
    pcVar9 = "(null)";
LAB_001398bb:
    local_60 = "012xxx34";
    pcStack_70 = "(\"012xxx34\")";
    pcVar5 = "(string).buffer == (\"012xxx34\")";
    iVar2 = 0x68c;
  }
  else {
    uStack_50 = 0x139526;
    iVar2 = strcmp("012xxx34",string.buffer);
    if (iVar2 != 0) {
      pcVar4 = "\"";
      goto LAB_001398bb;
    }
    uStack_50 = 0x13953f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x68c);
    if (string.size != 8) {
      local_60 = "strlen(\"012xxx34\")";
      pcVar5 = "(string).size == strlen(\"012xxx34\")";
      pcVar8 = "(string).size";
      pcVar4 = (char *)string.size;
      goto LAB_00139927;
    }
    uStack_50 = 0x13955f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x68c);
    if (private_ACUtilsTest_AString_reallocCount != 0) {
      ppcVar7 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar9 = "private_ACUtilsTest_AString_reallocCount";
      iVar2 = 0x68d;
LAB_00139dad:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) =
           test_AString_replaceRangeAString_success_smallerReplaceLength_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_50 = 0x139580;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x68d);
    uStack_50 = 0x139594;
    bVar1 = AString_replaceRangeAString(&string,3,3,(AString *)0x0);
    if (bVar1 == false) {
      pcVar4 = "Assertion \'AString_replaceRangeAString(&string, 3, 3, ((void*)0))\' failed";
      iVar2 = 0x68e;
      goto LAB_00139c47;
    }
    uStack_50 = 0x1395ad;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x68e);
    if (string.capacity != 8) {
      local_60 = "(8)";
      pcVar5 = "(string).capacity == (8)";
      pcVar8 = "(string).capacity";
      iVar2 = 0x68f;
      pcVar4 = (char *)string.capacity;
      goto LAB_00139c82;
    }
    uStack_50 = 0x1395cd;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x68f);
    if (string.buffer == (char *)0x0) {
      ppcVar7 = &local_58;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar2 = 0x68f;
      goto LAB_00139dad;
    }
    uStack_50 = 0x1395ea;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x68f);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
LAB_00139a0e:
      local_60 = "01234";
      pcStack_70 = "(\"01234\")";
      pcVar5 = "(string).buffer == (\"01234\")";
      iVar2 = 0x68f;
    }
    else {
      uStack_50 = 0x139607;
      iVar2 = strcmp("01234",string.buffer);
      if (iVar2 != 0) {
        pcVar4 = "\"";
        goto LAB_00139a0e;
      }
      uStack_50 = 0x139620;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x68f);
      if (string.size != 5) {
        local_60 = "strlen(\"01234\")";
        pcVar5 = "(string).size == strlen(\"01234\")";
        pcVar8 = "(string).size";
        iVar2 = 0x68f;
        local_58 = (char *)0x5;
        pcVar4 = (char *)string.size;
LAB_00139c88:
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        ppcVar6 = &local_60;
        goto LAB_00139c8a;
      }
      uStack_50 = 0x139640;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x68f);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar7 = &local_68;
        local_60 = "(0)";
        local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar9 = "private_ACUtilsTest_AString_reallocCount";
        iVar2 = 0x690;
        goto LAB_00139dad;
      }
      uStack_50 = 0x139661;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x690);
      uStack_50 = 0x139675;
      bVar1 = AString_replaceRangeAString(&string,3,0x29a,(AString *)0x0);
      if (bVar1 == false) {
        pcVar4 = "Assertion \'AString_replaceRangeAString(&string, 3, 666, ((void*)0))\' failed";
        iVar2 = 0x691;
        goto LAB_00139c47;
      }
      uStack_50 = 0x13968e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x691);
      if (string.capacity != 8) {
        local_60 = "(8)";
        pcVar5 = "(string).capacity == (8)";
        pcVar8 = "(string).capacity";
        iVar2 = 0x692;
        pcVar4 = (char *)string.capacity;
LAB_00139c82:
        local_58 = (char *)0x8;
        goto LAB_00139c88;
      }
      uStack_50 = 0x1396ae;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x692);
      if (string.buffer == (char *)0x0) {
        ppcVar7 = &local_58;
        pcVar5 = "Assertion \'_ck_x != NULL\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %#x";
        pcVar8 = "(void*) (string).buffer != NULL";
        pcVar9 = "(void*) (string).buffer";
        iVar2 = 0x692;
        goto LAB_00139dad;
      }
      uStack_50 = 0x1396cb;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x692);
      pcVar9 = string.buffer;
      if (string.buffer == (char *)0x0) {
        pcVar4 = "";
        pcVar9 = "(null)";
      }
      else {
        uStack_50 = 0x1396e8;
        iVar2 = strcmp("012",string.buffer);
        if (iVar2 == 0) {
          uStack_50 = 0x139701;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x692);
          if (string.size != 3) {
            local_60 = "strlen(\"012\")";
            pcVar5 = "(string).size == strlen(\"012\")";
            pcVar8 = "(string).size";
            iVar2 = 0x692;
            local_58 = (char *)0x3;
            pcVar4 = (char *)string.size;
            goto LAB_00139c88;
          }
          uStack_50 = 0x139721;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x692);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar7 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar9 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x693;
            goto LAB_00139dad;
          }
          uStack_50 = 0x139742;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x693);
          uStack_50 = 0x139753;
          bVar1 = AString_replaceRangeAString(&string,0,4,(AString *)0x0);
          if (bVar1 == false) {
            pcVar4 = "Assertion \'AString_replaceRangeAString(&string, 0, 4, ((void*)0))\' failed";
            iVar2 = 0x694;
            goto LAB_00139c47;
          }
          uStack_50 = 0x13976c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x694);
          if (string.capacity == 8) {
            uStack_50 = 0x13978c;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x695);
            if (string.buffer == (char *)0x0) {
              ppcVar7 = &local_58;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) (string).buffer != NULL";
              pcVar9 = "(void*) (string).buffer";
            }
            else {
              uStack_50 = 0x1397a9;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x695);
              if (string.buffer == (char *)0x0) {
                pcStack_80 = "(null)";
                pcStack_78 = "";
LAB_00139cd7:
                uStack_50 = 0;
                local_58 = "\"";
                local_60 = "";
                local_68 = "\"";
                pcStack_70 = "(\"\")";
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x695,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(string).buffer == (\"\")","(string).buffer",pcStack_78);
              }
              if (*string.buffer != '\0') {
                pcStack_78 = "\"";
                pcStack_80 = string.buffer;
                goto LAB_00139cd7;
              }
              uStack_50 = 0x1397d9;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x695);
              if (string.size == 0) {
                uStack_50 = 0x1397f8;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x695);
                if (private_ACUtilsTest_AString_reallocCount == 0) {
                  uStack_50 = 0x139819;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x696);
                  uStack_50 = 0x139822;
                  (*string.deallocator)(string.buffer);
                  return;
                }
                ppcVar7 = &local_68;
                local_60 = "(0)";
                local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar9 = "private_ACUtilsTest_AString_reallocCount";
                iVar2 = 0x696;
                goto LAB_00139dad;
              }
              ppcVar7 = &local_68;
              local_60 = "strlen(\"\")";
              local_68 = (char *)string.size;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "(string).size == strlen(\"\")";
              pcVar9 = "(string).size";
            }
            iVar2 = 0x695;
            goto LAB_00139dad;
          }
          local_60 = "(8)";
          pcVar5 = "(string).capacity == (8)";
          pcVar8 = "(string).capacity";
          iVar2 = 0x695;
          pcVar4 = (char *)string.capacity;
          goto LAB_00139c82;
        }
        pcVar4 = "\"";
      }
      local_60 = "012";
      pcStack_70 = "(\"012\")";
      pcVar5 = "(string).buffer == (\"012\")";
      iVar2 = 0x692;
    }
  }
  pcVar8 = "(string).buffer";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_68 = "\"";
  ppcVar6 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar4;
LAB_00139c8a:
  uStack_50 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x139c91;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}